

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncAESSettings *aes)

{
  bool bVar1;
  long lVar2;
  unsigned_long_long uVar3;
  long unaff_RBX;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_50;
  longlong local_48;
  ContentEncAESSettings *local_40;
  long local_38;
  
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x104f,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  local_40 = aes;
  if (aes == (ContentEncAESSettings *)0x0) {
    __assert_fail("aes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1050,
                  "long mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry(long long, long long, IMkvReader *, ContentEncAESSettings *)"
                 );
  }
  stop = size + start;
  local_50 = start;
  do {
    if (stop <= local_50) {
      return 0;
    }
    lVar2 = ParseElementHeader(pReader,&local_50,stop,&local_38,&local_48);
    if (lVar2 < 0) {
      bVar1 = false;
      unaff_RBX = lVar2;
    }
    else {
      if (local_38 == 0x47e8) {
        uVar3 = UnserializeUInt(pReader,local_50,local_48);
        local_40->cipher_mode = uVar3;
        if (uVar3 != 1) {
          bVar1 = false;
          unaff_RBX = -2;
          goto LAB_00111e32;
        }
      }
      local_50 = local_50 + local_48;
      bVar1 = local_50 <= stop;
      if (stop < local_50) {
        unaff_RBX = -2;
      }
    }
LAB_00111e32:
    if (!bVar1) {
      return unaff_RBX;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncAESSettingsEntry(
    long long start, long long size, IMkvReader* pReader,
    ContentEncAESSettings* aes) {
  assert(pReader);
  assert(aes);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvAESSettingsCipherMode) {
      aes->cipher_mode = UnserializeUInt(pReader, pos, size);
      if (aes->cipher_mode != 1)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}